

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

void __thiscall
UnitBoundedPolynomial<3U,_2U>::walk
          (UnitBoundedPolynomial<3U,_2U> *this,double deltatau,
          _func_void_VectorNd_double_UnitBoundedPolynomial<3U,_2U>_ptr_void_ptr *fn,void *payload,
          double a,double b)

{
  ulong uVar1;
  double dVar2;
  VectorNd VVar3;
  VectorNd VVar4;
  
  while (a <= b) {
    uVar1 = -(ulong)(b - a < deltatau);
    VVar4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (double)(~uVar1 & (ulong)a | uVar1 & (ulong)b);
    dVar2 = b;
    VVar3 = interpolate((UnitBoundedPolynomial<3U,_2U> *)&stack0xffffffffffffffc8,
                        VVar4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                        .m_data.array[0]);
    VVar4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         VVar3.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [1];
    (*fn)(VVar4,dVar2,(UnitBoundedPolynomial<3U,_2U> *)&stack0xffffffffffffffc8,this);
    a = VVar4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
        + deltatau;
  }
  return;
}

Assistant:

void UnitBoundedPolynomial<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, double, const UnitBoundedPolynomial<Order, Dims>&, void *), void *payload, double a, double b) const
{
    double tau = a;
    while (tau <= b)
    {
        if (b - tau < deltatau)
        {
            tau = b;
        }

        fn(interpolate(tau), tau, *this, payload);

        tau += deltatau;
    }
}